

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat-types.h
# Opt level: O0

Clause * Clause_new<vec<Lit>>(vec<Lit> *ps,bool learnt)

{
  byte learnt_00;
  uint uVar1;
  Clause *pCVar2;
  int iVar3;
  byte in_SIL;
  vec<Lit> *in_RDI;
  Clause *unaff_retaddr;
  Clause *newClause;
  void *mem;
  size_t mem_size;
  size_t s;
  undefined8 local_18;
  
  learnt_00 = in_SIL & 1;
  local_18 = 0;
  uVar1 = vec<Lit>::size(in_RDI);
  if (uVar1 != 0) {
    uVar1 = vec<Lit>::size(in_RDI);
    local_18 = (ulong)(uVar1 - 1);
  }
  iVar3 = 0;
  if ((learnt_00 & 1) != 0) {
    iVar3 = 3;
  }
  pCVar2 = (Clause *)malloc(local_18 * 4 + 8 + (long)iVar3 * 4);
  Clause::Clause<vec<Lit>>(unaff_retaddr,in_RDI,(bool)learnt_00);
  return pCVar2;
}

Assistant:

static Clause* Clause_new(const V& ps, bool learnt = false) {
	size_t s = 0;
	if (ps.size() != 0) {
		s = ps.size() - 1;
	}
	const size_t mem_size = sizeof(Clause) + s * sizeof(Lit) + (learnt ? 3 : 0) * sizeof(int);
	void* mem = malloc(mem_size);
	auto* newClause = new (mem) Clause(ps, learnt);
	return newClause;
}